

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamHttp::~BamHttp(BamHttp *this)

{
  long lVar1;
  void *pvVar2;
  TcpSocket *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__BamHttp_0023ab20;
  (**(code **)(*(long *)in_RDI + 0x10))();
  lVar1._0_4_ = (in_RDI->m_remoteAddress).m_protocol;
  lVar1._4_4_ = (in_RDI->m_remoteAddress).m_ip4Address;
  if ((lVar1 != 0) && (pvVar2 = *(void **)&in_RDI->m_remoteAddress, pvVar2 != (void *)0x0)) {
    TcpSocket::~TcpSocket(in_RDI);
    operator_delete(pvVar2);
  }
  std::__cxx11::string::~string((string *)&in_RDI->m_cachedSocketDescriptor);
  std::__cxx11::string::~string((string *)(in_RDI->m_remoteAddress).m_ipString.field_2._M_local_buf)
  ;
  std::__cxx11::string::~string((string *)&(in_RDI->m_remoteAddress).m_ip6Address);
  IBamIODevice::~IBamIODevice((IBamIODevice *)0x1e210f);
  return;
}

Assistant:

BamHttp::~BamHttp()
{

    // close connection & clean up
    Close();
    if (m_socket) delete m_socket;
}